

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O1

void __thiscall
t_markdown_generator::generate_typedef(t_markdown_generator *this,t_typedef *ttypedef)

{
  ofstream_with_content_based_conditional_update *poVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  t_type *ttype;
  string name;
  char local_41;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  iVar3 = (*(ttypedef->super_t_type).super_t_doc._vptr_t_doc[3])(ttypedef);
  lVar2 = *(long *)CONCAT44(extraout_var,iVar3);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,lVar2,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar2);
  poVar1 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"### Typedef: ",0xd);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_40,local_38);
  local_41 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_41,1);
  print_doc(this,(t_doc *)ttypedef);
  local_41 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_41,1);
  local_41 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_41,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"_Base type_: **",0xf);
  ttype = t_typedef::get_type(ttypedef);
  print_type(this,ttype);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"**",2);
  local_41 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_41,1);
  local_41 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_41,1);
  local_41 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_41,1);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void t_markdown_generator::generate_typedef(t_typedef* ttypedef) {
  string name = ttypedef->get_name();
  f_out_ << "### Typedef: " << name  << endl;
  print_doc(ttypedef);
  f_out_ << endl << endl;
  f_out_ << "_Base type_: **";
  print_type(ttypedef->get_type());
  f_out_ << "**" << endl << endl;
  f_out_ << endl;
}